

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O3

string_type * __thiscall
booster::locale::impl_posix::collator<wchar_t>::do_transform_abi_cxx11_
          (string_type *__return_storage_ptr__,collator<wchar_t> *this,char_type_conflict *b,
          char_type_conflict *e)

{
  size_t __new_size;
  vector<wchar_t,_std::allocator<wchar_t>_> buf;
  string_type s;
  allocator_type local_59;
  vector<wchar_t,_std::allocator<wchar_t>_> local_58;
  wchar_t *local_40 [2];
  wchar_t local_30 [4];
  
  local_40[0] = local_30;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_40,b,e);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            (&local_58,((long)e - (long)b >> 1) + 1,&local_59);
  __new_size = wcsxfrm_l(local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                         super__Vector_impl_data._M_start,local_40[0],
                         (long)local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2,
                         (__locale_t)
                         *(this->lc_).
                          super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((ulong)((long)local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<wchar_t,_std::allocator<wchar_t>_>::resize(&local_58,__new_size);
    wcsxfrm_l(local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
              super__Vector_impl_data._M_start,local_40[0],__new_size,
              (__locale_t)
              *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,
             local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
             super__Vector_impl_data._M_start + __new_size);
  if (local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.super__Vector_impl_data
      ._M_start != (wchar_t *)0x0) {
    operator_delete(local_58.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual string_type do_transform(char_type const *b,char_type const *e) const
    {
        string_type s(b,e-b);
        std::vector<char_type> buf((e-b)*2+1);
        size_t n = coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),buf.size(),*lc_);
        if(n>buf.size()) {
            buf.resize(n);
            coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),n,*lc_);
        }
        return string_type(&buf.front(),n);
    }